

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O3

void __thiscall
pstore::file::system_error::system_error
          (system_error *this,error_code code,czstring user_message,string *path)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  error_code __ec;
  string local_58;
  char *local_38;
  
  __ec._M_cat = code._M_cat;
  *(undefined ***)this = &PTR__system_error_001388a8;
  local_38 = "File";
  if (user_message != (czstring)0x0) {
    local_38 = user_message;
  }
  message<char_const*>(&local_58,this,&local_38,path);
  __ec._0_8_ = code._0_8_ & 0xffffffff;
  std::system_error::system_error(&this->super_system_error,__ec,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  *(undefined ***)this = &PTR__system_error_001388a8;
  paVar1 = &(this->path_).field_2;
  (this->path_)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (path->_M_dataplus)._M_p;
  paVar2 = &path->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&path->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->path_).field_2 + 8) = uVar4;
  }
  else {
    (this->path_)._M_dataplus._M_p = pcVar3;
    (this->path_).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->path_)._M_string_length = path->_M_string_length;
  (path->_M_dataplus)._M_p = (pointer)paVar2;
  path->_M_string_length = 0;
  (path->field_2)._M_local_buf[0] = '\0';
  return;
}

Assistant:

system_error::system_error (std::error_code const code, gsl::czstring const user_message,
                                    std::string path)
                : std::system_error (
                      code, message (user_message != nullptr ? user_message : "File", path))
                , path_ (std::move (path)) {}